

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_OneofPresence_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceSerializeTest_OneofPresence_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  OneofFieldCase OVar2;
  Arena *pAVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_7c0;
  Message local_7b8;
  size_t local_7b0;
  int local_7a4;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_9;
  Message local_788;
  OneofFieldCase local_780 [2];
  undefined1 local_778 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_748;
  Message local_740;
  string local_738;
  string_view local_718;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar__5;
  Message local_6e8;
  string local_6e0;
  unsigned_long local_6c0;
  int local_6b4;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_680;
  Message local_678;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__4;
  Message local_650;
  OneofFieldCase local_648 [2];
  undefined1 local_640 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_610;
  Message local_608;
  string local_600;
  string_view local_5e0;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__3;
  Message local_5b0;
  string local_5a8;
  unsigned_long local_588;
  int local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_548;
  Message local_540;
  bool local_531;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__2;
  Message local_518;
  OneofFieldCase local_510 [2];
  undefined1 local_508 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_4d8;
  Message local_4d0;
  string local_4c8;
  string_view local_4a8;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__1;
  Message local_478;
  string local_470;
  char local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_3;
  Message local_430;
  string local_428;
  char local_401;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_2;
  Message local_3e8;
  string local_3e0;
  char local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  Message local_3a0;
  string local_398;
  unsigned_long local_378;
  int local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar;
  string local_350;
  AssertHelper local_330;
  Message local_328;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_;
  TypeParam *output_sink;
  undefined1 local_2f0 [8];
  TestAllTypes message;
  NoFieldPresenceSerializeTest_OneofPresence_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  message.field_0._664_8_ = this;
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_2f0);
  OVar2 = proto2_nofieldpresence_unittest::TestAllTypes::oneof_field_case((TestAllTypes *)local_2f0)
  ;
  if (OVar2 != kOneofString) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2f0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_has_oneof_string((TestAllTypes *)local_2f0);
    internal::ArenaStringPtr::InitDefault((ArenaStringPtr *)((long)&message.field_0 + 0x288));
  }
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_2f0);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)((long)&message.field_0 + 0x288),anon_var_dwarf_37cdd0 + 5,pAVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::GetOutputSinkRef(&this->
                             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           );
  local_319 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                        ((MessageLite *)local_2f0,
                         (string *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_318,&local_319,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,(internal *)local_318,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    testing::Message::~Message(&local_328);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_36c = 3;
    NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::GetOutput(&local_398,
                &this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
    local_378 = std::__cxx11::string::size();
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_368,"3","this->GetOutput().size()",&local_36c,&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
    if (!bVar1) {
      testing::Message::Message(&local_3a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4d7,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_3a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
    local_3b9 = -0x76;
    NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::GetOutput(&local_3e0,
                &this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&local_3e0);
    testing::internal::EqHelper::Compare<char,_char,_nullptr>
              ((EqHelper *)local_3b8,"static_cast<char>(0x8a)","this->GetOutput().at(0)",&local_3b9,
               pcVar4);
    std::__cxx11::string::~string((string *)&local_3e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
    if (!bVar1) {
      testing::Message::Message(&local_3e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4d8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_3e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
    local_401 = '\a';
    NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::GetOutput(&local_428,
                &this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&local_428);
    testing::internal::EqHelper::Compare<char,_char,_nullptr>
              ((EqHelper *)local_400,"static_cast<char>(0x07)","this->GetOutput().at(1)",&local_401,
               pcVar4);
    std::__cxx11::string::~string((string *)&local_428);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
    if (!bVar1) {
      testing::Message::Message(&local_430);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4d9,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_430);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
    local_449 = '\0';
    NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::GetOutput(&local_470,
                &this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&local_470);
    testing::internal::EqHelper::Compare<char,_char,_nullptr>
              ((EqHelper *)local_448,"static_cast<char>(0x00)","this->GetOutput().at(2)",&local_449,
               pcVar4);
    std::__cxx11::string::~string((string *)&local_470);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar1) {
      testing::Message::Message(&local_478);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4da,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_478);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_478);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2f0);
    NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::GetOutput(&local_4c8,
                &this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
    local_4a8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4c8);
    local_491 = protobuf::MessageLite::ParseFromString((MessageLite *)local_2f0,local_4a8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_490,&local_491,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_4c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
    if (!bVar1) {
      testing::Message::Message(&local_4d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_4.message_,(internal *)local_490,
                 (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4dd,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
      testing::internal::AssertHelper::~AssertHelper(&local_4d8);
      std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_4d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
    local_510[1] = 0x71;
    local_510[0] = proto2_nofieldpresence_unittest::TestAllTypes::oneof_field_case
                             ((TestAllTypes *)local_2f0);
    testing::internal::EqHelper::
    Compare<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,_proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,_nullptr>
              ((EqHelper *)local_508,"TestAllTypes::kOneofString","message.oneof_field_case()",
               local_510 + 1,local_510);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
    if (!bVar1) {
      testing::Message::Message(&local_518);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4de,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_518);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_518);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
    proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2f0);
    proto2_nofieldpresence_unittest::TestAllTypes::set_oneof_uint32((TestAllTypes *)local_2f0,0);
    local_531 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                          ((MessageLite *)local_2f0,
                           (string *)
                           gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_530,&local_531,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
    if (!bVar1) {
      testing::Message::Message(&local_540);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_5.message_,(internal *)local_530,
                 (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_548,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4e3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_548,&local_540);
      testing::internal::AssertHelper::~AssertHelper(&local_548);
      std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_540);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_57c = 3;
      NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::GetOutput(&local_5a8,
                  &this->
                   super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
      local_588 = std::__cxx11::string::size();
      testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                ((EqHelper *)local_578,"3","this->GetOutput().size()",&local_57c,&local_588);
      std::__cxx11::string::~string((string *)&local_5a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
      if (!bVar1) {
        testing::Message::Message(&local_5b0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4e4,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_5b0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_5b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
      NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::GetOutput(&local_600,
                  &this->
                   super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
      local_5e0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_600);
      local_5c9 = protobuf::MessageLite::ParseFromString((MessageLite *)local_2f0,local_5e0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_600);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
      if (!bVar1) {
        testing::Message::Message(&local_608);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_6.message_,(internal *)local_5c8,
                   (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_610,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4e5,pcVar4);
        testing::internal::AssertHelper::operator=(&local_610,&local_608);
        testing::internal::AssertHelper::~AssertHelper(&local_610);
        std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_608);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
      local_648[1] = 0x6f;
      local_648[0] = proto2_nofieldpresence_unittest::TestAllTypes::oneof_field_case
                               ((TestAllTypes *)local_2f0);
      testing::internal::EqHelper::
      Compare<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,_proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,_nullptr>
                ((EqHelper *)local_640,"TestAllTypes::kOneofUint32","message.oneof_field_case()",
                 local_648 + 1,local_648);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
      if (!bVar1) {
        testing::Message::Message(&local_650);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4e6,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_650)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_650);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
      proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2f0);
      proto2_nofieldpresence_unittest::TestAllTypes::set_oneof_enum
                ((TestAllTypes *)local_2f0,TestAllTypes_NestedEnum_FOO);
      local_669 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                            ((MessageLite *)local_2f0,
                             (string *)
                             gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_668,&local_669,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
      if (!bVar1) {
        testing::Message::Message(&local_678);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_7.message_,(internal *)local_668,
                   (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_680,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4ea,pcVar4);
        testing::internal::AssertHelper::operator=(&local_680,&local_678);
        testing::internal::AssertHelper::~AssertHelper(&local_680);
        std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_678);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_6b4 = 3;
        NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::GetOutput(&local_6e0,
                    &this->
                     super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   );
        local_6c0 = std::__cxx11::string::size();
        testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_6b0,"3","this->GetOutput().size()",&local_6b4,&local_6c0);
        std::__cxx11::string::~string((string *)&local_6e0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
        if (!bVar1) {
          testing::Message::Message(&local_6e8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4eb,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__5.message_,&local_6e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_6e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
        NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::GetOutput(&local_738,
                    &this->
                     super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   );
        local_718 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_738);
        local_701 = protobuf::MessageLite::ParseFromString((MessageLite *)local_2f0,local_718);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_700,&local_701,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_738);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
        if (!bVar1) {
          testing::Message::Message(&local_740);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_8.message_,(internal *)local_700,
                     (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",
                     in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_748,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4ec,pcVar4);
          testing::internal::AssertHelper::operator=(&local_748,&local_740);
          testing::internal::AssertHelper::~AssertHelper(&local_748);
          std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
          testing::Message::~Message(&local_740);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
        local_780[1] = 0x72;
        local_780[0] = proto2_nofieldpresence_unittest::TestAllTypes::oneof_field_case
                                 ((TestAllTypes *)local_2f0);
        testing::internal::EqHelper::
        Compare<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,_proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,_nullptr>
                  ((EqHelper *)local_778,"TestAllTypes::kOneofEnum","message.oneof_field_case()",
                   local_780 + 1,local_780);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
        if (!bVar1) {
          testing::Message::Message(&local_788);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4ed,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_788);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_788);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
        proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2f0);
        OVar2 = proto2_nofieldpresence_unittest::TestAllTypes::oneof_field_case
                          ((TestAllTypes *)local_2f0);
        if (OVar2 != kOneofString) {
          proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field
                    ((TestAllTypes *)local_2f0);
          proto2_nofieldpresence_unittest::TestAllTypes::set_has_oneof_string
                    ((TestAllTypes *)local_2f0);
          internal::ArenaStringPtr::InitDefault((ArenaStringPtr *)((long)&message.field_0 + 0x288));
        }
        pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_2f0);
        internal::ArenaStringPtr::Set
                  ((ArenaStringPtr *)((long)&message.field_0 + 0x288),"test",pAVar3);
        proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_string((TestAllTypes *)local_2f0)
        ;
        local_7a4 = 0;
        local_7b0 = proto2_nofieldpresence_unittest::TestAllTypes::ByteSizeLong
                              ((TestAllTypes *)local_2f0);
        testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_7a0,"0","message.ByteSizeLong()",&local_7a4,&local_7b0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
        if (!bVar1) {
          testing::Message::Message(&local_7b8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_7c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4f2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_7c0,&local_7b8);
          testing::internal::AssertHelper::~AssertHelper(&local_7c0);
          testing::Message::~Message(&local_7b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2f0);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, OneofPresence) {
  TestAllTypes message;
  // oneof fields still have field presence -- ensure that this goes on the wire
  // even though its value is the empty string.
  message.set_oneof_string("");
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  // Tag: 113 --> tag is (113 << 3) | 2 (length delimited) = 906
  // varint: 0x8a 0x07
  // Length: 0x00
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_EQ(static_cast<char>(0x8a), this->GetOutput().at(0));
  EXPECT_EQ(static_cast<char>(0x07), this->GetOutput().at(1));
  EXPECT_EQ(static_cast<char>(0x00), this->GetOutput().at(2));

  message.Clear();
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofString, message.oneof_field_case());

  // Also test int32 and enum fields.
  message.Clear();
  message.set_oneof_uint32(0);  // would not go on wire if ordinary field.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofUint32, message.oneof_field_case());

  message.Clear();
  message.set_oneof_enum(TestAllTypes::FOO);  // FOO is the default value.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofEnum, message.oneof_field_case());

  message.Clear();
  message.set_oneof_string("test");
  message.clear_oneof_string();
  EXPECT_EQ(0, message.ByteSizeLong());
}